

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprCodeInlineFunction(Parse *pParse,ExprList *pFarg,int iFuncId,int target)

{
  uint uVar1;
  Vdbe *p;
  byte bVar2;
  int iVar3;
  Op *pOVar4;
  int op;
  long lVar5;
  char *zP4;
  long in_FS_OFFSET;
  char *azAff [6];
  undefined1 local_88 [40];
  char *pcStack_60;
  undefined8 local_58;
  AggInfo *pAStack_50;
  anon_union_8_3_c79b3df9_for_y local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (5 < (uint)iFuncId) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar3 = sqlite3ExprCodeTarget(pParse,pFarg->a[0].pExpr,target);
      return iVar3;
    }
    goto LAB_0017a73e;
  }
  p = pParse->pVdbe;
  switch(iFuncId) {
  case 0:
    uVar1 = pFarg->nExpr;
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    sqlite3ExprCode(pParse,pFarg->a[0].pExpr,target);
    if (1 < (int)uVar1) {
      lVar5 = 0;
      do {
        sqlite3VdbeAddOp3(p,0x34,target,iVar3,0);
        sqlite3ExprCode(pParse,*(Expr **)((long)pFarg[1].a + lVar5 + -8),target);
        lVar5 = lVar5 + 0x18;
      } while ((ulong)uVar1 * 0x18 + -0x18 != lVar5);
    }
    if (p->db->mallocFailed == '\0') {
      pOVar4 = p->aOp + (long)p->nOp + -1;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if ((pOVar4->opcode == 'P') && (0 < (long)p->nOp)) {
      p->aOp[(long)p->nOp + -1].p5 = 1;
    }
    sqlite3VdbeResolveLabel(p,iVar3);
    break;
  case 1:
    if (**(char **)(pFarg + 1) == -0x58) {
      iVar3 = sqlite3ExprImpliesNonNullRow
                        (pFarg->a[0].pExpr,*(int *)(*(char **)(pFarg + 1) + 0x2c),1);
      goto LAB_0017a614;
    }
    op = 0x4b;
    iVar3 = 0;
    goto LAB_0017a61e;
  case 2:
    iVar3 = sqlite3ExprImpliesExpr(pParse,pFarg->a[0].pExpr,*(Expr **)(pFarg + 1),-1);
    goto LAB_0017a614;
  case 3:
    iVar3 = sqlite3ExprCompare((Parse *)0x0,pFarg->a[0].pExpr,*(Expr **)(pFarg + 1),-1);
LAB_0017a614:
    op = 0x47;
LAB_0017a61e:
    sqlite3VdbeAddOp3(p,op,iVar3,target,0);
    break;
  case 4:
    local_88._0_8_ = "blob";
    local_88._8_8_ = "text";
    local_88._16_8_ = "numeric";
    local_88._24_8_ = "integer";
    local_88._32_8_ = "real";
    pcStack_60 = "flexnum";
    bVar2 = sqlite3ExprAffinity(pFarg->a[0].pExpr);
    if ((char)bVar2 < 'A') {
      zP4 = "none";
    }
    else {
      zP4 = *(char **)(local_88 + (ulong)(bVar2 - 0x41) * 8);
    }
    iVar3 = sqlite3VdbeAddOp3(p,0x76,0,target,0);
    sqlite3VdbeChangeP4(p,iVar3,zP4,0);
    break;
  case 5:
    local_88._8_8_ = (char *)0x0;
    pcStack_60 = (char *)0x0;
    local_88._16_8_ = (Expr *)0x0;
    local_88._24_8_ = (Expr *)0x0;
    local_58._0_2_ = 0;
    local_58._2_2_ = 0;
    local_58._4_4_ = (anon_union_4_2_009eaf8f_for_w)0x0;
    pAStack_50 = (AggInfo *)0x0;
    local_48.pTab = (Table *)0x0;
    local_88._0_8_ = (char *)0x9e;
    local_88._32_8_ = pFarg;
    target = sqlite3ExprCodeTarget(pParse,(Expr *)local_88,target);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return target;
  }
LAB_0017a73e:
  __stack_chk_fail();
}

Assistant:

static int exprCodeInlineFunction(
  Parse *pParse,        /* Parsing context */
  ExprList *pFarg,      /* List of function arguments */
  int iFuncId,          /* Function ID.  One of the INTFUNC_... values */
  int target            /* Store function result in this register */
){
  int nFarg;
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  assert( pFarg!=0 );
  nFarg = pFarg->nExpr;
  assert( nFarg>0 );  /* All in-line functions have at least one argument */
  switch( iFuncId ){
    case INLINEFUNC_coalesce: {
      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      int endCoalesce = sqlite3VdbeMakeLabel(pParse);
      int i;
      assert( nFarg>=2 );
      sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
      for(i=1; i<nFarg; i++){
        sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
        VdbeCoverage(v);
        sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
      }
      setDoNotMergeFlagOnCopy(v);
      sqlite3VdbeResolveLabel(v, endCoalesce);
      break;
    }
    case INLINEFUNC_iif: {
      Expr caseExpr;
      memset(&caseExpr, 0, sizeof(caseExpr));
      caseExpr.op = TK_CASE;
      caseExpr.x.pList = pFarg;
      return sqlite3ExprCodeTarget(pParse, &caseExpr, target);
    }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
    case INLINEFUNC_sqlite_offset: {
      Expr *pArg = pFarg->a[0].pExpr;
      if( pArg->op==TK_COLUMN && pArg->iTable>=0 ){
        sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }
#endif
    default: {
      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      assert( nFarg==1 || nFarg==2 );
      target = sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      break;
    }

  /***********************************************************************
  ** Test-only SQL functions that are only usable if enabled
  ** via SQLITE_TESTCTRL_INTERNAL_FUNCTIONS
  */
#if !defined(SQLITE_UNTESTABLE)
    case INLINEFUNC_expr_compare: {
      /* Compare two expressions using sqlite3ExprCompare() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprCompare(0,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_expr_implies_expr: {
      /* Compare two expressions using sqlite3ExprImpliesExpr() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprImpliesExpr(pParse,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_implies_nonnull_row: {
      /* Result of sqlite3ExprImpliesNonNullRow() */
      Expr *pA1;
      assert( nFarg==2 );
      pA1 = pFarg->a[1].pExpr;
      if( pA1->op==TK_COLUMN ){
        sqlite3VdbeAddOp2(v, OP_Integer,
           sqlite3ExprImpliesNonNullRow(pFarg->a[0].pExpr,pA1->iTable,1),
           target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }

    case INLINEFUNC_affinity: {
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      const char *azAff[] = { "blob", "text", "numeric", "integer",
                              "real", "flexnum" };
      char aff;
      assert( nFarg==1 );
      aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
      assert( aff<=SQLITE_AFF_NONE
           || (aff>=SQLITE_AFF_BLOB && aff<=SQLITE_AFF_FLEXNUM) );
      sqlite3VdbeLoadString(v, target,
              (aff<=SQLITE_AFF_NONE) ? "none" : azAff[aff-SQLITE_AFF_BLOB]);
      break;
    }
#endif /* !defined(SQLITE_UNTESTABLE) */
  }
  return target;
}